

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Group.c
# Opt level: O0

Llb_Grp_t * Llb_ManGroupCreate(Llb_Man_t *pMan,Aig_Obj_t *pObj)

{
  Aig_Man_t *pAVar1;
  int iVar2;
  Llb_Grp_t *pGroup;
  Aig_Obj_t *pAVar3;
  Vec_Ptr_t *pVVar4;
  Llb_Grp_t *p;
  Aig_Obj_t *pObj_local;
  Llb_Man_t *pMan_local;
  
  if (((uint)(*(ulong *)&pObj->field_0x18 >> 4) & 1) != 1) {
    __assert_fail("pObj->fMarkA == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                  ,0xb2,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
  }
  pGroup = Llb_ManGroupAlloc(pMan);
  Vec_PtrPush(pGroup->vOuts,pObj);
  Aig_ManIncrementTravId(pMan->pAig);
  iVar2 = Aig_ObjIsCo(pObj);
  if (iVar2 == 0) {
    pAVar1 = pMan->pAig;
    pAVar3 = Aig_ObjFanin0(pObj);
    Llb_ManGroupCreate_rec(pAVar1,pAVar3,pGroup->vIns);
    pAVar1 = pMan->pAig;
    pAVar3 = Aig_ObjFanin1(pObj);
    Llb_ManGroupCreate_rec(pAVar1,pAVar3,pGroup->vIns);
  }
  else {
    pAVar1 = pMan->pAig;
    pAVar3 = Aig_ObjFanin0(pObj);
    Llb_ManGroupCreate_rec(pAVar1,pAVar3,pGroup->vIns);
  }
  if (pGroup->vNodes == (Vec_Ptr_t *)0x0) {
    pVVar4 = Llb_ManGroupCollect(pGroup);
    pGroup->vNodes = pVVar4;
    return pGroup;
  }
  __assert_fail("p->vNodes == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Group.c"
                ,0xbf,"Llb_Grp_t *Llb_ManGroupCreate(Llb_Man_t *, Aig_Obj_t *)");
}

Assistant:

Llb_Grp_t * Llb_ManGroupCreate( Llb_Man_t * pMan, Aig_Obj_t * pObj )
{
    Llb_Grp_t * p;
    assert( pObj->fMarkA == 1 );
    // derive group
    p = Llb_ManGroupAlloc( pMan );
    Vec_PtrPush( p->vOuts, pObj );
    Aig_ManIncrementTravId( pMan->pAig );
    if ( Aig_ObjIsCo(pObj) )
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
    else
    {
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin0(pObj), p->vIns );
        Llb_ManGroupCreate_rec( pMan->pAig, Aig_ObjFanin1(pObj), p->vIns );
    }
    // derive internal objects
    assert( p->vNodes == NULL );
    p->vNodes = Llb_ManGroupCollect( p );
    return p;
}